

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_analysis_simplification.cpp
# Opt level: O3

SENode * __thiscall spvtools::opt::SENodeSimplifyImpl::Simplify(SENodeSimplifyImpl *this)

{
  pointer ppSVar1;
  SENode *pSVar2;
  NodePtr pSVar3;
  NodePtr pSVar4;
  int iVar5;
  SENode *pSVar6;
  SERecurrentNode *recurrent_expr;
  undefined4 extraout_var_00;
  pointer ppSVar7;
  dag_iterator child_iterator;
  dag_iterator local_e0;
  dag_iterator local_88;
  undefined4 extraout_var;
  
  iVar5 = (**this->node_->_vptr_SENode)();
  if (((iVar5 != 2) && (iVar5 = (**this->node_->_vptr_SENode)(), iVar5 != 3)) &&
     (iVar5 = (**this->node_->_vptr_SENode)(), iVar5 != 4)) {
    return this->node_;
  }
  pSVar6 = SimplifyPolynomial(this);
  this->node_ = pSVar6;
  pSVar6 = FoldRecurrentAddExpressions(this,pSVar6);
  pSVar6 = EliminateZeroCoefficientRecurrents(this,pSVar6);
  ppSVar1 = (pSVar6->children_).
            super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  recurrent_expr = (SERecurrentNode *)0x0;
  for (ppSVar7 = (pSVar6->children_).
                 super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppSVar7 != ppSVar1;
      ppSVar7 = ppSVar7 + 1) {
    pSVar2 = *ppSVar7;
    iVar5 = (**pSVar2->_vptr_SENode)(pSVar2);
    if (iVar5 == 1) {
      iVar5 = (*pSVar2->_vptr_SENode[6])(pSVar2);
      recurrent_expr = (SERecurrentNode *)CONCAT44(extraout_var,iVar5);
    }
  }
  SENode::graph_begin(&local_e0,pSVar6);
  SENode::graph_end(&local_88,pSVar6);
  pSVar4 = local_88.current_;
  pSVar3 = local_e0.current_;
  std::
  _Deque_base<std::pair<spvtools::opt::SENode_*,___gnu_cxx::__normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::SENode_*,___gnu_cxx::__normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>_>_>_>
  ::~_Deque_base((_Deque_base<std::pair<spvtools::opt::SENode_*,___gnu_cxx::__normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::SENode_*,___gnu_cxx::__normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>_>_>_>
                  *)&local_88.parent_iterators_);
  if (pSVar3 != pSVar4) {
    do {
      iVar5 = (**(local_e0.current_)->_vptr_SENode)();
      if ((iVar5 == 1) &&
         (iVar5 = (*(local_e0.current_)->_vptr_SENode[6])(),
         recurrent_expr != (SERecurrentNode *)CONCAT44(extraout_var_00,iVar5))) {
        std::
        _Deque_base<std::pair<spvtools::opt::SENode_*,___gnu_cxx::__normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::SENode_*,___gnu_cxx::__normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>_>_>_>
        ::~_Deque_base((_Deque_base<std::pair<spvtools::opt::SENode_*,___gnu_cxx::__normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::SENode_*,___gnu_cxx::__normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>_>_>_>
                        *)&local_e0.parent_iterators_);
        return pSVar6;
      }
      TreeDFIterator<spvtools::opt::SENode>::operator++(&local_e0);
      SENode::graph_end(&local_88,pSVar6);
      pSVar4 = local_88.current_;
      pSVar3 = local_e0.current_;
      std::
      _Deque_base<std::pair<spvtools::opt::SENode_*,___gnu_cxx::__normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::SENode_*,___gnu_cxx::__normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>_>_>_>
      ::~_Deque_base((_Deque_base<std::pair<spvtools::opt::SENode_*,___gnu_cxx::__normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::SENode_*,___gnu_cxx::__normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>_>_>_>
                      *)&local_88.parent_iterators_);
    } while (pSVar3 != pSVar4);
  }
  std::
  _Deque_base<std::pair<spvtools::opt::SENode_*,___gnu_cxx::__normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::SENode_*,___gnu_cxx::__normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>_>_>_>
  ::~_Deque_base((_Deque_base<std::pair<spvtools::opt::SENode_*,___gnu_cxx::__normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::SENode_*,___gnu_cxx::__normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>_>_>_>
                  *)&local_e0.parent_iterators_);
  if (recurrent_expr != (SERecurrentNode *)0x0) {
    pSVar6 = SimplifyRecurrentAddExpression(this,recurrent_expr);
  }
  return pSVar6;
}

Assistant:

SENode* SENodeSimplifyImpl::Simplify() {
  // We only handle graphs with an addition, multiplication, or negation, at the
  // root.
  if (node_->GetType() != SENode::Add && node_->GetType() != SENode::Multiply &&
      node_->GetType() != SENode::Negative)
    return node_;

  SENode* simplified_polynomial = SimplifyPolynomial();

  SERecurrentNode* recurrent_expr = nullptr;
  node_ = simplified_polynomial;

  // Fold recurrent expressions which are with respect to the same loop into a
  // single recurrent expression.
  simplified_polynomial = FoldRecurrentAddExpressions(simplified_polynomial);

  simplified_polynomial =
      EliminateZeroCoefficientRecurrents(simplified_polynomial);

  // Traverse the immediate children of the new node to find the recurrent
  // expression. If there is more than one there is nothing further we can do.
  for (SENode* child : simplified_polynomial->GetChildren()) {
    if (child->GetType() == SENode::RecurrentAddExpr) {
      recurrent_expr = child->AsSERecurrentNode();
    }
  }

  // We need to count the number of unique recurrent expressions in the DAG to
  // ensure there is only one.
  for (auto child_iterator = simplified_polynomial->graph_begin();
       child_iterator != simplified_polynomial->graph_end(); ++child_iterator) {
    if (child_iterator->GetType() == SENode::RecurrentAddExpr &&
        recurrent_expr != child_iterator->AsSERecurrentNode()) {
      return simplified_polynomial;
    }
  }

  if (recurrent_expr) {
    return SimplifyRecurrentAddExpression(recurrent_expr);
  }

  return simplified_polynomial;
}